

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::build_composite_combiner_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t return_type,uint32_t *elems,
          uint32_t length)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  char *pcVar5;
  bool local_115;
  bool local_f1;
  TypedID<(spirv_cross::Types)0> local_cc;
  string local_c8;
  uint32_t local_a8;
  bool local_a1;
  string local_a0 [7];
  bool uses_buffer_offset;
  SPIRExpression *local_80;
  SPIRExpression *e;
  byte local_6e;
  bool local_6d;
  uint32_t i;
  bool swizzle_optimization;
  bool can_apply_swizzle_opt;
  SPIRType *local_60;
  SPIRType *type;
  string subop;
  TypedID<(spirv_cross::Types)0> local_30;
  uint32_t local_2c;
  ID base;
  uint32_t length_local;
  uint32_t *elems_local;
  uint32_t return_type_local;
  CompilerGLSL *this_local;
  string *op;
  
  local_2c = length;
  _base = elems;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_30,0);
  subop.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::string((string *)&type);
  local_60 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,return_type);
  local_f1 = false;
  if (local_60->basetype != Struct) {
    bVar1 = VectorView<unsigned_int>::empty(&(local_60->array).super_VectorView<unsigned_int>);
    local_f1 = false;
    if (bVar1) {
      local_f1 = local_60->columns == 1;
    }
  }
  local_6d = local_f1;
  local_6e = 0;
  e._4_4_ = 0;
  do {
    if (local_2c <= e._4_4_) {
      if ((local_6e & 1) != 0) {
        if (((this->backend).swizzle_is_function & 1U) != 0) {
          ::std::__cxx11::string::operator+=((string *)&type,"()");
        }
        bVar1 = remove_duplicate_swizzle(this,(string *)&type);
        if (!bVar1) {
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_30);
          remove_unity_swizzle(this,uVar2,(string *)&type);
        }
        strip_enclosed_expression(this,(string *)&type);
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&type);
      subop.field_2._M_local_buf[0xf] = '\x01';
      ::std::__cxx11::string::~string((string *)&type);
      if ((subop.field_2._M_local_buf[0xf] & 1U) == 0) {
        ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    local_80 = Compiler::maybe_get<spirv_cross::SPIRExpression>
                         (&this->super_Compiler,_base[e._4_4_]);
    if ((((local_6d & 1U) == 0) || (local_80 == (SPIRExpression *)0x0)) ||
       (uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_80->super_IVariant).field_0xc), uVar2 == 0)) {
LAB_003bb7dd:
      if ((local_6e & 1) == 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&type);
      }
      else {
        if (((this->backend).swizzle_is_function & 1U) != 0) {
          ::std::__cxx11::string::operator+=((string *)&type,"()");
        }
        bVar1 = remove_duplicate_swizzle(this,(string *)&type);
        if (!bVar1) {
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_30);
          remove_unity_swizzle(this,uVar2,(string *)&type);
        }
        strip_enclosed_expression(this,(string *)&type);
        local_6e = 0;
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&type);
      }
      if (e._4_4_ != 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      local_115 = false;
      if (local_60->basetype == Struct) {
        local_a8 = (uint32_t)
                   TypedID::operator_cast_to_TypedID((TypedID *)&(local_60->super_IVariant).self);
        local_115 = Compiler::has_member_decoration
                              (&this->super_Compiler,(TypeID)local_a8,e._4_4_,DecorationOffset);
      }
      local_a1 = local_115;
      to_composite_constructor_expression_abi_cxx11_
                (&local_c8,this,local_60,_base[e._4_4_],local_115);
      ::std::__cxx11::string::operator=((string *)&type,(string *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(local_80->super_IVariant).field_0xc);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_30);
      if (uVar2 != uVar3) goto LAB_003bb7dd;
      uVar4 = ::std::__cxx11::string::empty();
      bVar1 = false;
      if ((uVar4 & 1) == 0) {
        pcVar5 = (char *)::std::__cxx11::string::front();
        bVar1 = *pcVar5 == '.';
      }
      if (!bVar1) {
        __assert_fail("!e->expression.empty() && e->expression.front() == \'.\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x2d3a,
                      "string spirv_cross::CompilerGLSL::build_composite_combiner(uint32_t, const uint32_t *, uint32_t)"
                     );
      }
      ::std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_80->expression);
      ::std::__cxx11::string::operator+=((string *)&type,local_a0);
      ::std::__cxx11::string::~string(local_a0);
      local_6e = 1;
    }
    if (local_80 == (SPIRExpression *)0x0) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_cc,0);
    }
    else {
      local_cc.id = *(uint32_t *)&(local_80->super_IVariant).field_0xc;
    }
    local_30.id = local_cc.id;
    e._4_4_ = e._4_4_ + 1;
  } while( true );
}

Assistant:

string CompilerGLSL::build_composite_combiner(uint32_t return_type, const uint32_t *elems, uint32_t length)
{
	ID base = 0;
	string op;
	string subop;

	// Can only merge swizzles for vectors.
	auto &type = get<SPIRType>(return_type);
	bool can_apply_swizzle_opt = type.basetype != SPIRType::Struct && type.array.empty() && type.columns == 1;
	bool swizzle_optimization = false;

	for (uint32_t i = 0; i < length; i++)
	{
		auto *e = maybe_get<SPIRExpression>(elems[i]);

		// If we're merging another scalar which belongs to the same base
		// object, just merge the swizzles to avoid triggering more than 1 expression read as much as possible!
		if (can_apply_swizzle_opt && e && e->base_expression && e->base_expression == base)
		{
			// Only supposed to be used for vector swizzle -> scalar.
			assert(!e->expression.empty() && e->expression.front() == '.');
			subop += e->expression.substr(1, string::npos);
			swizzle_optimization = true;
		}
		else
		{
			// We'll likely end up with duplicated swizzles, e.g.
			// foobar.xyz.xyz from patterns like
			// OpVectorShuffle
			// OpCompositeExtract x 3
			// OpCompositeConstruct 3x + other scalar.
			// Just modify op in-place.
			if (swizzle_optimization)
			{
				if (backend.swizzle_is_function)
					subop += "()";

				// Don't attempt to remove unity swizzling if we managed to remove duplicate swizzles.
				// The base "foo" might be vec4, while foo.xyz is vec3 (OpVectorShuffle) and looks like a vec3 due to the .xyz tacked on.
				// We only want to remove the swizzles if we're certain that the resulting base will be the same vecsize.
				// Essentially, we can only remove one set of swizzles, since that's what we have control over ...
				// Case 1:
				//  foo.yxz.xyz: Duplicate swizzle kicks in, giving foo.yxz, we are done.
				//               foo.yxz was the result of OpVectorShuffle and we don't know the type of foo.
				// Case 2:
				//  foo.xyz: Duplicate swizzle won't kick in.
				//           If foo is vec3, we can remove xyz, giving just foo.
				if (!remove_duplicate_swizzle(subop))
					remove_unity_swizzle(base, subop);

				// Strips away redundant parens if we created them during component extraction.
				strip_enclosed_expression(subop);
				swizzle_optimization = false;
				op += subop;
			}
			else
				op += subop;

			if (i)
				op += ", ";

			bool uses_buffer_offset =
			    type.basetype == SPIRType::Struct && has_member_decoration(type.self, i, DecorationOffset);
			subop = to_composite_constructor_expression(type, elems[i], uses_buffer_offset);
		}

		base = e ? e->base_expression : ID(0);
	}

	if (swizzle_optimization)
	{
		if (backend.swizzle_is_function)
			subop += "()";

		if (!remove_duplicate_swizzle(subop))
			remove_unity_swizzle(base, subop);
		// Strips away redundant parens if we created them during component extraction.
		strip_enclosed_expression(subop);
	}

	op += subop;
	return op;
}